

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int backtrack_loop(saucy *s)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  saucy_stats *psVar6;
  bool bVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  int start;
  int iVar12;
  long lVar13;
  uint uVar14;
  int *start_1;
  int *piVar15;
  int *piVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  double dVar22;
  
  do {
    iVar12 = s->lev + -1;
    s->lev = iVar12;
    if (iVar12 == 0) {
      return -1;
    }
    rewind_coloring(s,&s->right,iVar12);
    iVar18 = s->lev;
    lVar10 = (long)iVar18;
    s->nsplits = s->splitlev[lVar10];
    lVar13 = (long)s->ndiffs;
    iVar12 = s->difflev[lVar10];
    if (iVar12 < s->ndiffs) {
      do {
        lVar10 = lVar13 + -1;
        lVar13 = lVar13 + -1;
        s->diffmark[s->diffs[lVar10]] = '\0';
        iVar18 = s->lev;
        lVar10 = (long)iVar18;
        iVar12 = s->difflev[lVar10];
      } while (iVar12 < lVar13);
    }
    s->ndiffs = iVar12;
    s->nundiffs = s->undifflev[lVar10];
    iVar12 = s->anc;
    if (iVar18 < iVar12) {
      piVar16 = s->start;
      lVar13 = (long)piVar16[lVar10];
      piVar9 = (s->left).lab;
      iVar12 = (s->right).clen[lVar13];
      s->anc = iVar18;
      s->indmin = piVar9[iVar12 + lVar13];
      s->match = 1;
      piVar9 = s->splitlev;
      lVar13 = (long)piVar9[lVar10 + 1];
      if (piVar9[lVar10] < piVar9[lVar10 + 1]) {
        piVar2 = s->splitfrom;
        piVar15 = s->threp;
        piVar3 = s->splitwho;
        piVar11 = s->thnext;
        piVar4 = s->thprev;
        do {
          iVar12 = piVar2[lVar13 + -1];
          uVar14 = piVar15[iVar12];
          uVar1 = piVar15[piVar3[lVar13 + -1]];
          uVar21 = (ulong)(int)uVar1;
          piVar11[piVar4[(int)uVar14]] = uVar1;
          piVar11[piVar4[uVar21]] = uVar14;
          iVar18 = piVar4[(int)uVar14];
          piVar4[(int)uVar14] = piVar4[uVar21];
          piVar4[uVar21] = iVar18;
          if (uVar1 != uVar14) {
            piVar5 = s->thfront;
            do {
              iVar18 = (int)uVar21;
              piVar5[iVar18] = iVar12;
              uVar21 = (ulong)(uint)piVar11[iVar18];
            } while (piVar11[iVar18] != uVar14);
          }
          lVar13 = lVar13 + -1;
        } while (piVar9[s->anc] < lVar13);
        iVar18 = s->lev;
      }
      else {
        piVar11 = s->thnext;
        piVar15 = s->threp;
      }
      s->kanctar = 0;
      iVar12 = piVar15[piVar16[iVar18]];
      piVar16 = s->anctar;
      s->kanctar = 1;
      *piVar16 = iVar12;
      for (iVar18 = piVar11[iVar12]; iVar18 != iVar12; iVar18 = piVar11[iVar18]) {
        iVar17 = s->kanctar;
        s->kanctar = iVar17 + 1;
        piVar16[iVar17] = iVar18;
      }
      piVar9 = s->thsize;
      iVar12 = s->kanctar;
      uVar14 = 1;
      do {
        uVar14 = uVar14 * 3 + 1;
      } while ((int)uVar14 < iVar12 / 3);
      do {
        if ((int)uVar14 < iVar12) {
          lVar10 = (long)(int)uVar14;
          iVar18 = 0;
          do {
            iVar17 = piVar16[lVar10];
            iVar20 = iVar18;
            do {
              lVar13 = (long)(int)(uVar14 + iVar20);
              if (piVar9[piVar16[iVar20]] <= piVar9[iVar17]) break;
              piVar16[(int)(uVar14 + iVar20)] = piVar16[iVar20];
              bVar7 = (int)uVar14 <= iVar20;
              lVar13 = (long)iVar20;
              iVar20 = iVar20 - uVar14;
            } while (bVar7);
            piVar16[lVar13] = iVar17;
            lVar10 = lVar10 + 1;
            iVar18 = iVar18 + 1;
          } while (lVar10 != iVar12);
        }
        bVar7 = 2 < (int)uVar14;
        uVar14 = uVar14 / 3;
      } while (bVar7);
      iVar18 = s->lev;
      iVar12 = s->anc;
    }
    if (iVar18 == iVar12) {
      iVar12 = s->indmin;
      piVar9 = s->theta;
      iVar18 = iVar12;
      do {
        iVar17 = iVar18;
        iVar18 = piVar9[iVar17];
      } while (iVar17 != piVar9[iVar17]);
      iVar18 = piVar9[iVar12];
      if (iVar18 != iVar17) {
        piVar16 = piVar9 + iVar12;
        do {
          *piVar16 = iVar17;
          piVar16 = piVar9 + iVar18;
          iVar18 = *piVar16;
        } while (iVar18 != iVar17);
      }
      iVar12 = s->thsize[iVar17];
      if (0 < s->npairs) {
        piVar16 = s->pairs;
        piVar15 = s->unpairs;
        lVar10 = 0;
        do {
          piVar15[piVar16[lVar10]] = -1;
          lVar10 = lVar10 + 1;
        } while (lVar10 < s->npairs);
      }
      s->npairs = 0;
      if (0 < s->ndiffnons) {
        piVar16 = s->diffnons;
        piVar15 = s->undiffnons;
        lVar10 = 0;
        do {
          piVar15[piVar16[lVar10]] = -1;
          lVar10 = lVar10 + 1;
        } while (lVar10 < s->ndiffnons);
      }
      s->ndiffnons = 0;
      s->npairs = 0;
      s->nundiffs = 0;
      s->ndiffs = 0;
      piVar16 = s->start;
      iVar8 = piVar16[s->lev];
      if (iVar12 != (s->right).clen[iVar8] + 1) {
        iVar18 = s->indmin;
        iVar17 = iVar18;
        do {
          iVar20 = iVar17;
          iVar17 = piVar9[iVar20];
        } while (iVar20 != piVar9[iVar20]);
        iVar17 = piVar9[iVar18];
        if (iVar17 != iVar20) {
          piVar15 = piVar9 + iVar18;
          do {
            *piVar15 = iVar20;
            piVar15 = piVar9 + iVar17;
            iVar17 = *piVar15;
          } while (iVar17 != iVar20);
        }
        do {
          iVar18 = s->kanctar;
          if ((long)iVar18 == 0) goto LAB_002a85bd;
          s->kanctar = iVar18 + -1;
          iVar18 = s->anctar[(long)iVar18 + -1];
          iVar17 = iVar18;
          do {
            iVar19 = iVar17;
            iVar17 = piVar9[iVar19];
          } while (iVar19 != piVar9[iVar19]);
          iVar17 = piVar9[iVar18];
          if (iVar17 != iVar19) {
            piVar15 = piVar9 + iVar18;
            do {
              *piVar15 = iVar19;
              piVar15 = piVar9 + iVar17;
              iVar17 = *piVar15;
            } while (iVar17 != iVar19);
          }
        } while ((iVar19 != iVar18) || (iVar19 == iVar20));
        iVar8 = (s->right).unlab[iVar18] - iVar8;
        if (iVar8 != -1) break;
      }
LAB_002a85bd:
      psVar6 = s->stats;
      dVar22 = (double)iVar12 * psVar6->grpsize_base;
      psVar6->grpsize_base = dVar22;
      iVar8 = -1;
      if (10000000000.0 < dVar22) {
        psVar6->grpsize_base = dVar22 / 10000000000.0;
        psVar6->grpsize_exp = psVar6->grpsize_exp + 10;
      }
    }
    else {
      piVar9 = (s->right).clen;
      piVar16 = s->start;
      iVar12 = piVar16[iVar18];
      lVar10 = (long)iVar12;
      iVar17 = piVar9[lVar10];
      iVar18 = s->specmin[iVar18];
      if (0 < s->npairs) {
        piVar15 = s->pairs;
        piVar11 = s->unpairs;
        lVar13 = 0;
        do {
          piVar11[piVar15[lVar13]] = -1;
          lVar13 = lVar13 + 1;
        } while (lVar13 < s->npairs);
      }
      s->npairs = 0;
      if (0 < s->ndiffnons) {
        piVar15 = s->diffnons;
        piVar11 = s->undiffnons;
        lVar13 = 0;
        do {
          piVar11[piVar15[lVar13]] = -1;
          lVar13 = lVar13 + 1;
        } while (lVar13 < s->ndiffnons);
      }
      lVar13 = iVar17 + lVar10;
      s->ndiffnons = -1;
      s->npairs = -1;
      piVar15 = (s->right).lab;
      iVar20 = piVar15[lVar13];
      if (iVar20 == iVar18) {
        piVar15 = piVar15 + lVar10;
        iVar12 = piVar9[lVar10];
        piVar9 = piVar15;
        if (iVar12 != 0) {
          iVar18 = *piVar15;
          lVar10 = (long)(iVar12 + 1) * 4 + -4;
          piVar11 = piVar15;
          do {
            piVar11 = piVar11 + 1;
            if (*piVar11 < iVar18) {
              piVar9 = piVar11;
              iVar18 = *piVar11;
            }
            lVar10 = lVar10 + -4;
          } while (lVar10 != 0);
        }
        iVar8 = (int)((ulong)((long)piVar9 - (long)piVar15) >> 2);
        if (iVar17 == iVar8) {
          iVar8 = orbit_prune(s);
        }
      }
      else {
        iVar8 = orbit_prune(s);
        if (iVar8 == -1) {
          iVar8 = -1;
        }
        else {
          iVar12 = iVar12 + iVar8;
          if (piVar15[iVar12] != iVar18) break;
          piVar9 = (s->right).unlab;
          piVar15[iVar12] = iVar20;
          piVar9[iVar20] = iVar12;
          piVar15[lVar13] = iVar18;
          piVar9[iVar18] = (int)lVar13;
          iVar8 = orbit_prune(s);
        }
      }
    }
  } while (iVar8 == -1);
  return iVar8 + piVar16[s->lev];
}

Assistant:

static int
backtrack_loop(struct saucy *s)
{
    int min;

    /* Backtrack as long as we're exhausting target cells */
    for (--s->lev; s->lev; --s->lev) {
        min = do_backtrack(s);
        if (min != -1) return min + s->start[s->lev];
    }
    return -1;
}